

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O0

void __thiscall
GlobOpt::UpdateIntBoundsForNotEqualBranch
          (GlobOpt *this,Value *src1Value,Value *src2Value,int32 src2ConstantValue)

{
  code *pcVar1;
  bool bVar2;
  ValueNumber VVar3;
  ValueNumber VVar4;
  int32 iVar5;
  int32 iVar6;
  int32 iVar7;
  int32 iVar8;
  undefined4 *puVar9;
  ValueInfo *pVVar10;
  PathDependentInfo local_70;
  PathDependentInfo local_58;
  IntConstantBounds local_3c;
  IntConstantBounds local_34;
  IntConstantBounds src2ConstantBounds;
  IntConstantBounds src1ConstantBounds;
  int32 src2ConstantValue_local;
  Value *src2Value_local;
  Value *src1Value_local;
  GlobOpt *this_local;
  
  if (src1Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0xdc,"(src1Value)","src1Value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar2 = DoPathDependentValues(this);
  if (bVar2) {
    if (src2Value != (Value *)0x0) {
      VVar3 = ::Value::GetValueNumber(src1Value);
      VVar4 = ::Value::GetValueNumber(src2Value);
      if (VVar3 == VVar4) {
        return;
      }
    }
    bVar2 = IsLoopPrePass(this);
    if (((!bVar2) && (bVar2 = DoAggressiveIntTypeSpec(this), bVar2)) &&
       (bVar2 = DoConstFold(this), bVar2)) {
      IntConstantBounds::IntConstantBounds(&src2ConstantBounds);
      IntConstantBounds::IntConstantBounds(&local_34);
      pVVar10 = ::Value::GetValueInfo(src1Value);
      bVar2 = ValueInfo::TryGetIntConstantBounds(pVVar10,&src2ConstantBounds,true);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0xe7,
                           "(src1Value->GetValueInfo()->TryGetIntConstantBounds(&src1ConstantBounds, true))"
                           ,
                           "src1Value->GetValueInfo()->TryGetIntConstantBounds(&src1ConstantBounds, true)"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      if (src2Value == (Value *)0x0) {
        IntConstantBounds::IntConstantBounds(&local_3c,src2ConstantValue,src2ConstantValue);
        local_34 = local_3c;
      }
      else {
        pVVar10 = ::Value::GetValueInfo(src2Value);
        bVar2 = ValueInfo::TryGetIntConstantBounds(pVVar10,&local_34,true);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0xea,
                             "(src2Value->GetValueInfo()->TryGetIntConstantBounds(&src2ConstantBounds, true))"
                             ,
                             "src2Value->GetValueInfo()->TryGetIntConstantBounds(&src2ConstantBounds, true)"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
      }
      iVar5 = IntConstantBounds::LowerBound(&src2ConstantBounds);
      iVar6 = IntConstantBounds::UpperBound(&src2ConstantBounds);
      iVar7 = IntConstantBounds::LowerBound(&local_34);
      iVar8 = IntConstantBounds::UpperBound(&local_34);
      bVar2 = ValueInfo::IsEqualTo(src1Value,iVar5,iVar6,src2Value,iVar7,iVar8);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0xf8,
                           "(!ValueInfo::IsEqualTo( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound()))"
                           ,
                           "!ValueInfo::IsEqualTo( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound())"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      iVar5 = IntConstantBounds::LowerBound(&src2ConstantBounds);
      iVar6 = IntConstantBounds::UpperBound(&src2ConstantBounds);
      iVar7 = IntConstantBounds::LowerBound(&local_34);
      iVar8 = IntConstantBounds::UpperBound(&local_34);
      bVar2 = ValueInfo::IsNotEqualTo(src1Value,iVar5,iVar6,src2Value,iVar7,iVar8);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0x100,
                           "(!ValueInfo::IsNotEqualTo( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound()))"
                           ,
                           "!ValueInfo::IsNotEqualTo( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound())"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
    }
    PathDependentInfo::PathDependentInfo(&local_58,NotEqual,src1Value,src2Value,src2ConstantValue);
    SetPathDependentInfo(this,true,&local_58);
    PathDependentInfo::PathDependentInfo(&local_70,Equal,src1Value,src2Value,src2ConstantValue);
    SetPathDependentInfo(this,false,&local_70);
  }
  return;
}

Assistant:

void GlobOpt::UpdateIntBoundsForNotEqualBranch(
    Value *const src1Value,
    Value *const src2Value,
    const int32 src2ConstantValue)
{
    Assert(src1Value);

    if(!DoPathDependentValues() || (src2Value && src1Value->GetValueNumber() == src2Value->GetValueNumber()))
    {
        return;
    }

#if DBG
    if(!IsLoopPrePass() && DoAggressiveIntTypeSpec() && DoConstFold())
    {
        IntConstantBounds src1ConstantBounds, src2ConstantBounds;
        AssertVerify(src1Value->GetValueInfo()->TryGetIntConstantBounds(&src1ConstantBounds, true));
        if(src2Value)
        {
            AssertVerify(src2Value->GetValueInfo()->TryGetIntConstantBounds(&src2ConstantBounds, true));
        }
        else
        {
            src2ConstantBounds = IntConstantBounds(src2ConstantValue, src2ConstantValue);
        }

        Assert(
            !ValueInfo::IsEqualTo(
                src1Value,
                src1ConstantBounds.LowerBound(),
                src1ConstantBounds.UpperBound(),
                src2Value,
                src2ConstantBounds.LowerBound(),
                src2ConstantBounds.UpperBound()));
        Assert(
            !ValueInfo::IsNotEqualTo(
                src1Value,
                src1ConstantBounds.LowerBound(),
                src1ConstantBounds.UpperBound(),
                src2Value,
                src2ConstantBounds.LowerBound(),
                src2ConstantBounds.UpperBound()));
    }
#endif

    SetPathDependentInfo(
        true, PathDependentInfo(PathDependentRelationship::NotEqual, src1Value, src2Value, src2ConstantValue));
    SetPathDependentInfo(
        false, PathDependentInfo(PathDependentRelationship::Equal, src1Value, src2Value, src2ConstantValue));
}